

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sock.c
# Opt level: O2

void nn_sock_onleave(nn_ctx *self)

{
  uint uVar1;
  FILE *__stream;
  uint uVar2;
  char *pcVar3;
  nn_queue_item **ppnVar4;
  
  ppnVar4 = &self[-2].events.tail;
  if (self == (nn_ctx *)0x0) {
    ppnVar4 = (nn_queue_item **)0x0;
  }
  if (*(int *)(ppnVar4 + 0xb) == 2) {
    uVar2 = (**(code **)(*(long *)ppnVar4[0xc] + 0x30))();
    if ((int)uVar2 < 0) {
      nn_backtrace_print();
      __stream = _stderr;
      pcVar3 = nn_err_strerror(-uVar2);
      fprintf(__stream,"%s [%d] (%s:%d)\n",pcVar3,(ulong)-uVar2,
              "/workspace/llm4binary/github/license_all_cmakelists_25/nqbit[P]goestools/vendor/nanomsg/src/core/sock.c"
              ,0x30b);
      fflush(_stderr);
      nn_err_abort();
    }
    if ((*(byte *)((long)ppnVar4[0xd] + 8) & 1) == 0) {
      uVar1 = *(uint *)(ppnVar4 + 0xe);
      if ((uVar2 & 1) == 0) {
        if ((uVar1 & 1) != 0) {
          *(uint *)(ppnVar4 + 0xe) = uVar1 & 0xfffffffe;
          nn_efd_unsignal((nn_efd *)((long)ppnVar4 + 0xd4));
        }
      }
      else if ((uVar1 & 1) == 0) {
        *(uint *)(ppnVar4 + 0xe) = uVar1 | 1;
        nn_efd_signal((nn_efd *)((long)ppnVar4 + 0xd4));
      }
    }
    if ((*(byte *)((long)ppnVar4[0xd] + 8) & 2) == 0) {
      uVar1 = *(uint *)(ppnVar4 + 0xe);
      if ((uVar2 & 2) == 0) {
        if ((uVar1 & 2) != 0) {
          *(uint *)(ppnVar4 + 0xe) = uVar1 & 0xfffffffd;
          nn_efd_unsignal((nn_efd *)(ppnVar4 + 0x1a));
          return;
        }
      }
      else if ((uVar1 & 2) == 0) {
        *(uint *)(ppnVar4 + 0xe) = uVar1 | 2;
        nn_efd_signal((nn_efd *)(ppnVar4 + 0x1a));
        return;
      }
    }
  }
  return;
}

Assistant:

static void nn_sock_onleave (struct nn_ctx *self)
{
    struct nn_sock *sock;
    int events;

    sock = nn_cont (self, struct nn_sock, ctx);

    /*  If nn_close() was already called there's no point in adjusting the
        snd/rcv file descriptors. */
    if (nn_slow (sock->state != NN_SOCK_STATE_ACTIVE))
        return;

    /*  Check whether socket is readable and/or writable at the moment. */
    events = sock->sockbase->vfptr->events (sock->sockbase);
    errnum_assert (events >= 0, -events);

    /*  Signal/unsignal IN as needed. */
    if (!(sock->socktype->flags & NN_SOCKTYPE_FLAG_NORECV)) {
        if (events & NN_SOCKBASE_EVENT_IN) {
            if (!(sock->flags & NN_SOCK_FLAG_IN)) {
                sock->flags |= NN_SOCK_FLAG_IN;
                nn_efd_signal (&sock->rcvfd);
            }
        }
        else {
            if (sock->flags & NN_SOCK_FLAG_IN) {
                sock->flags &= ~NN_SOCK_FLAG_IN;
                nn_efd_unsignal (&sock->rcvfd);
            }
        }
    }

    /*  Signal/unsignal OUT as needed. */
    if (!(sock->socktype->flags & NN_SOCKTYPE_FLAG_NOSEND)) {
        if (events & NN_SOCKBASE_EVENT_OUT) {
            if (!(sock->flags & NN_SOCK_FLAG_OUT)) {
                sock->flags |= NN_SOCK_FLAG_OUT;
                nn_efd_signal (&sock->sndfd);
            }
        }
        else {
            if (sock->flags & NN_SOCK_FLAG_OUT) {
                sock->flags &= ~NN_SOCK_FLAG_OUT;
                nn_efd_unsignal (&sock->sndfd);
            }
        }
    }
}